

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

GLMClassifier *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::GLMClassifier>(Arena *arena)

{
  GLMClassifier *this;
  
  if (arena == (Arena *)0x0) {
    this = (GLMClassifier *)operator_new(0x50);
    CoreML::Specification::GLMClassifier::GLMClassifier(this,(Arena *)0x0,false);
  }
  else {
    this = (GLMClassifier *)
           AllocateAlignedWithHook
                     (arena,0x50,(type_info *)&CoreML::Specification::GLMClassifier::typeinfo);
    CoreML::Specification::GLMClassifier::GLMClassifier(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }